

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)10>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  QRgbaFloat32 *pQVar1;
  int in_ECX;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar2;
  int i;
  BPP bpp;
  undefined8 in_stack_ffffffffffffff68;
  uint rgb;
  int iVar3;
  undefined4 uVar4;
  undefined8 *in_stack_ffffffffffffffa0;
  uint s;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 5;
  for (iVar3 = 0; s = (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20), iVar3 < in_ECX;
      iVar3 = iVar3 + 1) {
    rgb = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    fetchPixel<(QPixelLayout::BPP)5>((uchar *)CONCAT44(uVar4,iVar3),rgb);
    convertPixelToARGB32PM<(QImage::Format)10>(s);
    QVar2 = QRgbaFloat<float>::fromArgb32(rgb);
    local_38 = QVar2._0_8_;
    local_30 = QVar2._8_8_;
    in_stack_ffffffffffffffa0 = &local_28;
    local_28._0_4_ = QVar2.r;
    local_20._4_4_ = QVar2.a;
    local_28._4_4_ = QVar2.g;
    local_20._0_4_ = QVar2.b;
    local_18 = CONCAT44(local_28._4_4_ * local_20._4_4_,(float)local_28 * local_20._4_4_);
    local_10 = CONCAT44(local_20._4_4_,(float)local_20 * local_20._4_4_);
    pQVar1 = in_RDI + iVar3;
    pQVar1->r = (float)local_28 * local_20._4_4_;
    pQVar1->g = local_28._4_4_ * local_20._4_4_;
    pQVar1->b = (float)local_20 * local_20._4_4_;
    pQVar1->a = local_20._4_4_;
    local_28 = local_38;
    local_20 = local_30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}